

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

complex dja::operator/(float_t a,complex *b)

{
  float fVar1;
  float fVar2;
  complex cVar3;
  float fVar4;
  
  fVar1 = b->re;
  fVar2 = b->im;
  fVar4 = 1.0 / (fVar1 * fVar1 + fVar2 * fVar2);
  cVar3.im = fVar4 * (fVar1 * 0.0 + a * -fVar2);
  cVar3.re = fVar4 * (fVar1 * a + fVar2 * 0.0);
  return cVar3;
}

Assistant:

Z bar(const Z& z) {return Z(z.re, -z.im);}